

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.hpp
# Opt level: O2

void __thiscall
libtest::printer::cprintf<char_const*,unsigned_long>
          (printer *this,ansi_sgr *command,char *args,unsigned_long args_1)

{
  ostream *poVar1;
  allocator<char> local_91;
  string local_90;
  string local_70;
  ansi_sgr local_50;
  string local_48;
  
  poVar1 = this->os;
  ansi_sgr::to_string_abi_cxx11_(&local_48,command);
  std::operator<<(poVar1,(string *)&local_48);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,args,&local_91);
  printf<unsigned_long>(this,&local_70,args_1);
  poVar1 = this->os;
  local_50.m_color = white;
  local_50.m_attr = reset;
  ansi_sgr::to_string_abi_cxx11_(&local_90,&local_50);
  std::operator<<(poVar1,(string *)&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void cprintf(const ansi_sgr& command, Args... args) { os << command.to_string(), printf(args...), os << ansi_sgr{}.to_string(); }